

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

void __thiscall
llm_tokenizer_ugm_session::tokenize
          (llm_tokenizer_ugm_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  _Rb_tree_header *p_Var1;
  llama_token *plVar2;
  char cVar3;
  undefined1 uVar4;
  llama_token id;
  int iVar5;
  undefined4 uVar6;
  pointer piVar7;
  pointer piVar8;
  iterator __position;
  _Base_ptr p_Var9;
  vector<int,std::allocator<int>> *this_00;
  bool bVar10;
  size_t sVar11;
  token_data *ptVar12;
  pointer pbVar13;
  undefined4 *puVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  llm_tokenizer_ugm *plVar17;
  ulong uVar18;
  pointer pbVar19;
  _Base_ptr p_Var20;
  size_t sVar21;
  long lVar22;
  bool bVar23;
  size_type sVar24;
  _Base_ptr p_Var25;
  ulong uVar26;
  float fVar27;
  vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
  tokenization_results;
  string normalized;
  allocator_type local_c1;
  pointer local_c0;
  long local_b8;
  ulong local_b0;
  llm_tokenizer_ugm_session *local_a8;
  size_t local_a0;
  ulong local_98;
  vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
  local_90;
  string local_78;
  long local_58;
  vector<int,std::allocator<int>> *local_50;
  value_type local_48;
  
  piVar7 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar8 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  normalize(this,text,&local_78);
  sVar24 = local_78._M_string_length;
  if (local_78._M_string_length != 0) {
    local_48.token_id =
         *(llama_token *)
          ((long)(this->vocab->pimpl)._M_t.
                 super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                 .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
    local_48.input_offset = 0;
    local_48.score_sum = -3.4028235e+38;
    local_50 = (vector<int,std::allocator<int>> *)output;
    llama_vocab::std::
    vector<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
    ::vector(&local_90,local_78._M_string_length + 1,&local_48,&local_c1);
    local_58 = (long)piVar8 - (long)piVar7;
    (local_90.
     super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
     ._M_impl.super__Vector_impl_data._M_start)->token_id =
         *(llama_token *)
          ((long)(this->vocab->pimpl)._M_t.
                 super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                 .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
    *(undefined8 *)
     &(local_90.
       super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_0x4 = 0;
    *(undefined8 *)
     ((long)&(local_90.
              super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
              ._M_impl.super__Vector_impl_data._M_start)->input_offset + 4) = 0;
    *(undefined4 *)
     &(local_90.
       super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
       ._M_impl.super__Vector_impl_data._M_start)->field_0x14 = 0;
    uVar26 = 0;
    local_b0 = sVar24;
    local_a8 = this;
    do {
      sVar11 = unicode_len_utf8(local_78._M_dataplus._M_p[uVar26]);
      sVar21 = sVar24 - uVar26;
      if (sVar11 <= sVar24 - uVar26) {
        sVar21 = sVar11;
      }
      lVar22 = uVar26 * 3;
      pbVar19 = local_90.
                super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar26;
      plVar17 = this->tokenizer;
      p_Var20 = (plVar17->token_matcher).children._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent;
      pbVar13 = local_90.
                super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (p_Var20 == (_Base_ptr)0x0) {
LAB_00219cad:
        fVar27 = pbVar19->score_sum + plVar17->unknown_token_score;
        if ((&pbVar13[sVar21].score_sum)[lVar22 * 2] <= fVar27 &&
            fVar27 != (&pbVar13[sVar21].score_sum)[lVar22 * 2]) {
          plVar2 = &pbVar13[sVar21].token_id + lVar22 * 2;
          *plVar2 = *(llama_token *)
                     ((long)(this->vocab->pimpl)._M_t.
                            super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                            .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
          *(ulong *)(plVar2 + 2) = uVar26;
          plVar2[4] = (llama_token)fVar27;
        }
      }
      else {
        cVar3 = local_78._M_dataplus._M_p[uVar26];
        p_Var1 = &(plVar17->token_matcher).children._M_t._M_impl.super__Rb_tree_header;
        p_Var25 = &p_Var1->_M_header;
        do {
          uVar4 = (undefined1)p_Var20[1]._M_color;
          if (cVar3 <= (char)uVar4) {
            p_Var25 = p_Var20;
          }
          p_Var20 = (&p_Var20->_M_left)[(char)uVar4 < cVar3];
        } while (p_Var20 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var25 == p_Var1) || (cVar3 < (char)p_Var25[1]._M_color)) ||
           (uVar18 = uVar26 + 1, local_c0 = pbVar19, local_b8 = lVar22, sVar24 < uVar18))
        goto LAB_00219cad;
        bVar23 = false;
        local_a0 = sVar21;
        local_98 = uVar26;
        while( true ) {
          if (*(char *)&p_Var25[2]._M_right == '\x01') {
            id = *(llama_token *)((long)&p_Var25[2]._M_right + 4);
            ptVar12 = llama_vocab::get_token_data(this->vocab,id);
            bVar10 = llama_vocab::impl::is_user_defined
                               ((impl *)(this->vocab->pimpl)._M_t.
                                        super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                                        .super__Head_base<0UL,_llama_vocab::impl_*,_false>,id);
            fVar27 = 0.0;
            if (!bVar10) {
              fVar27 = ptVar12->score;
            }
            bVar23 = (bool)(bVar23 | uVar18 - uVar26 == sVar21);
            fVar27 = local_c0->score_sum + fVar27;
            pbVar13 = local_90.
                      super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            this = local_a8;
            sVar21 = local_a0;
            sVar24 = local_b0;
            uVar26 = local_98;
            if (local_90.
                super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar18].score_sum < fVar27) {
              pbVar19 = local_90.
                        super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar18;
              pbVar19->token_id = id;
              pbVar19->input_offset = local_98;
              pbVar19->score_sum = fVar27;
            }
          }
          p_Var20 = p_Var25[1]._M_right;
          if (p_Var20 == (_Base_ptr)0x0) break;
          cVar3 = local_78._M_dataplus._M_p[uVar18];
          p_Var9 = p_Var25 + 1;
          p_Var25 = (_Base_ptr)&p_Var9->_M_left;
          do {
            uVar4 = (undefined1)p_Var20[1]._M_color;
            if (cVar3 <= (char)uVar4) {
              p_Var25 = p_Var20;
            }
            p_Var20 = (&p_Var20->_M_left)[(char)uVar4 < cVar3];
          } while (p_Var20 != (_Base_ptr)0x0);
          if (((p_Var25 == (_Base_ptr)&p_Var9->_M_left) || (cVar3 < (char)p_Var25[1]._M_color)) ||
             (uVar18 = uVar18 + 1, sVar24 < uVar18)) break;
        }
        if (!bVar23) {
          plVar17 = this->tokenizer;
          pbVar19 = local_c0;
          lVar22 = local_b8;
          goto LAB_00219cad;
        }
      }
      this_00 = local_50;
      lVar22 = local_58;
      uVar26 = uVar26 + sVar21;
    } while (uVar26 < sVar24);
    pbVar13 = pbVar13 + sVar24;
    bVar23 = false;
    while( true ) {
      iVar5 = pbVar13->token_id;
      bVar10 = iVar5 == *(int *)((long)(this->vocab->pimpl)._M_t.
                                       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                                       .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
      if (!(bool)(bVar23 & bVar10)) {
        __position._M_current = *(int **)(this_00 + 8);
        if (__position._M_current == *(int **)(this_00 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,__position,&pbVar13->token_id);
        }
        else {
          *__position._M_current = iVar5;
          *(int **)(this_00 + 8) = __position._M_current + 1;
        }
      }
      sVar21 = pbVar13->input_offset;
      if (sVar21 == 0) break;
      uVar6 = *(undefined4 *)
               &local_90.
                super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                ._M_impl.super__Vector_impl_data._M_start[sVar21].field_0x14;
      pbVar13->score_sum =
           local_90.
           super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar21].score_sum;
      *(undefined4 *)&pbVar13->field_0x14 = uVar6;
      pbVar19 = local_90.
                super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                ._M_impl.super__Vector_impl_data._M_start + sVar21;
      uVar6 = *(undefined4 *)&pbVar19->field_0x4;
      sVar21 = pbVar19->input_offset;
      pbVar13->token_id = pbVar19->token_id;
      *(undefined4 *)&pbVar13->field_0x4 = uVar6;
      pbVar13->input_offset = sVar21;
      bVar23 = bVar10;
    }
    puVar16 = (undefined4 *)(*(long *)this_00 + lVar22);
    puVar14 = *(undefined4 **)(this_00 + 8) + -1;
    if (puVar16 < puVar14 && puVar16 != *(undefined4 **)(this_00 + 8)) {
      puVar16 = (undefined4 *)(*(long *)this_00 + lVar22);
      do {
        puVar15 = puVar16 + 1;
        uVar6 = *puVar16;
        *puVar16 = *puVar14;
        *puVar14 = uVar6;
        puVar14 = puVar14 + -1;
        puVar16 = puVar15;
      } while (puVar15 < puVar14);
    }
    if (local_90.
        super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<llm_tokenizer_ugm_session::best_tokenization,_std::allocator<llm_tokenizer_ugm_session::best_tokenization>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        // get current size of output (for reversal later)
        size_t output_size = output.size();

        // normalize the input first
        std::string normalized;
        normalize(text, &normalized);
        size_t input_len = normalized.size();
        if (input_len == 0) {
            return;
        }

        // initialize score_sum to -FLT_MAX so it will be always lower than sums of token scores
        std::vector<struct best_tokenization> tokenization_results(input_len + 1, {vocab.token_unk(), 0, -FLT_MAX});
        // at the beginning tokenization score is zero
        tokenization_results[0] = { vocab.token_unk(), 0, 0 };

        for (size_t input_offset = 0; input_offset < input_len;) {
            size_t prefix_offset = input_offset;
            // calculate how many code units are in the currently processed UTF code point
            size_t n_utf8_code_units = std::min<size_t>(unicode_len_utf8(normalized[input_offset]), input_len - input_offset);

            // traverse the token matcher trie to find a matching token
            bool single_codepoint_token_found = false;
            const struct best_tokenization & current_best = tokenization_results[input_offset];
            const struct naive_trie * node = tokenizer.token_matcher.traverse(normalized[prefix_offset++]);

            while (prefix_offset <= input_len && node != NULL) {
                // check if we found valid token in prefix
                if (node->has_value) {
                    // check if it corresponds to the whole UTF code point
                    if (prefix_offset - input_offset == n_utf8_code_units) {
                        single_codepoint_token_found = true;
                    }
                    llama_token token_id = node->value;
                    const auto & token_data = vocab.get_token_data(token_id);

                    // we set the user-defined token scores to 0 to make them more likely to be selected
                    // (normal token scores are log probabilities, so they are negative)
                    // score type is double here to make tokenization results exactly
                    // the same as in the HF tokenizer using SentencePiece
                    const double token_score = vocab.is_user_defined(token_id) ? 0.0 : token_data.score;
                    const double challenger_score = current_best.score_sum + token_score;
                    struct best_tokenization & current_champ = tokenization_results[prefix_offset];
                    if (challenger_score > current_champ.score_sum) {
                        struct best_tokenization challenger = { token_id, input_offset, (float) challenger_score };
                        current_champ = challenger;
                    }
                }
                node = node->traverse(normalized[prefix_offset++]);
            }

            // if we didn't find a valid token corresponding to the whole UTF code point
            // then use unknown token as the tokenization of this UTF code point
            if (!single_codepoint_token_found) {
                const double challenger_score = current_best.score_sum + tokenizer.unknown_token_score;
                prefix_offset = input_offset + n_utf8_code_units;
                struct best_tokenization & current_champ = tokenization_results[prefix_offset];
                if (challenger_score > current_champ.score_sum) {
                    struct best_tokenization challenger = { vocab.token_unk(), input_offset, (float) challenger_score };
                    current_champ = challenger;
                }
            }

            // move to the next UTF code point
            input_offset += n_utf8_code_units;
        }

        // now backtrack from the end to gather token ids of the best tokenization
        // merge sequences of consecutive unknown tokens into single unknown tokens
        bool is_prev_unknown = false;
        for (struct best_tokenization & tokenization = tokenization_results[input_len]; ; tokenization = tokenization_results[tokenization.input_offset]) {
            bool is_unknown = tokenization.token_id == vocab.token_unk();
            if (!(is_prev_unknown && is_unknown)) {
                output.push_back(tokenization.token_id);
            }
            if (tokenization.input_offset == 0) {
                break;
            }
            is_prev_unknown = is_unknown;
        }

        // reverse the output since we added tokens starting from the end of the input
        std::reverse(output.begin() + output_size, output.end());
    }